

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_connecter_base.cpp
# Opt level: O0

int __thiscall zmq::stream_connecter_base_t::get_new_reconnect_ivl(stream_connecter_base_t *this)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  int *piVar4;
  long in_RDI;
  int interval;
  int random_jitter;
  int local_2c;
  int local_24;
  int local_14;
  int local_10;
  uint local_c;
  
  uVar2 = generate_random();
  local_c = uVar2 % *(uint *)(in_RDI + 0x160);
  iVar1 = *(int *)(in_RDI + 0x5bc);
  iVar3 = std::numeric_limits<int>::max();
  if (iVar1 < (int)(iVar3 - local_c)) {
    local_24 = *(int *)(in_RDI + 0x5bc) + local_c;
  }
  else {
    local_24 = std::numeric_limits<int>::max();
  }
  local_10 = local_24;
  if ((0 < *(int *)(in_RDI + 0x164)) && (*(int *)(in_RDI + 0x160) < *(int *)(in_RDI + 0x164))) {
    iVar1 = *(int *)(in_RDI + 0x5bc);
    iVar3 = std::numeric_limits<int>::max();
    if (iVar1 < iVar3 / 2) {
      local_14 = *(int *)(in_RDI + 0x5bc) << 1;
      piVar4 = std::min<int>(&local_14,(int *)(in_RDI + 0x164));
      local_2c = *piVar4;
    }
    else {
      local_2c = *(int *)(in_RDI + 0x164);
    }
    *(int *)(in_RDI + 0x5bc) = local_2c;
  }
  return local_10;
}

Assistant:

int zmq::stream_connecter_base_t::get_new_reconnect_ivl ()
{
    //  TODO should the random jitter be really based on the configured initial
    //  reconnect interval options.reconnect_ivl, or better on the
    //  _current_reconnect_ivl?

    //  The new interval is the current interval + random value.
    const int random_jitter = generate_random () % options.reconnect_ivl;
    const int interval =
      _current_reconnect_ivl < std::numeric_limits<int>::max () - random_jitter
        ? _current_reconnect_ivl + random_jitter
        : std::numeric_limits<int>::max ();

    //  Only change the new current reconnect interval if the maximum reconnect
    //  interval was set and if it's larger than the reconnect interval.
    if (options.reconnect_ivl_max > 0
        && options.reconnect_ivl_max > options.reconnect_ivl) {
        //  Calculate the next interval
        _current_reconnect_ivl =
          _current_reconnect_ivl < std::numeric_limits<int>::max () / 2
            ? std::min (_current_reconnect_ivl * 2, options.reconnect_ivl_max)
            : options.reconnect_ivl_max;
    }

    return interval;
}